

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_semantic_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t location,ExecutionModel em,
          StorageClass sc)

{
  long lVar1;
  undefined4 in_register_0000000c;
  string *psVar2;
  uint32_t local_c;
  
  local_c = location;
  if (sc == Input && em == ExecutionModelVertex) {
    psVar2 = (string *)
             &((this->remap_vertex_attributes).
               super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr)->semantic;
    for (lVar1 = (this->remap_vertex_attributes).
                 super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.buffer_size * 0x28;
        lVar1 != 0; lVar1 = lVar1 + -0x28) {
      if (*(uint32_t *)(psVar2 + -8) == location) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
        return __return_storage_ptr__;
      }
      psVar2 = psVar2 + 0x28;
    }
  }
  join<char_const(&)[9],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)"TEXCOORD",(char (*) [9])&local_c,
             (uint *)CONCAT44(in_register_0000000c,em));
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_semantic(uint32_t location, ExecutionModel em, StorageClass sc)
{
	if (em == ExecutionModelVertex && sc == StorageClassInput)
	{
		// We have a vertex attribute - we should look at remapping it if the user provided
		// vertex attribute hints.
		for (auto &attribute : remap_vertex_attributes)
			if (attribute.location == location)
				return attribute.semantic;
	}

	// Not a vertex attribute, or no remap_vertex_attributes entry.
	return join("TEXCOORD", location);
}